

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphanage_tests.cpp
# Opt level: O2

CTransactionRef __thiscall orphanage_tests::TxOrphanageTest::RandomOrphan(TxOrphanageTest *this)

{
  iterator iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
  *in_RSI;
  long in_FS_OFFSET;
  CTransactionRef CVar2;
  uint256 local_68;
  key_type local_48;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  RandomMixin<FastRandomContext>::rand256
            (&local_68,
             (RandomMixin<FastRandomContext> *)
             in_RSI[3]._M_impl.super__Rb_tree_header._M_header._M_right);
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x10];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x11];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x12];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x13];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x14];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x15];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x16];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x17];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x18];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x19];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x1e];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
       local_68.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
       local_68.super_base_blob<256U>.m_data._M_elems[0];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
       local_68.super_base_blob<256U>.m_data._M_elems[1];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
       local_68.super_base_blob<256U>.m_data._M_elems[2];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
       local_68.super_base_blob<256U>.m_data._M_elems[3];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
       local_68.super_base_blob<256U>.m_data._M_elems[4];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
       local_68.super_base_blob<256U>.m_data._M_elems[5];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
       local_68.super_base_blob<256U>.m_data._M_elems[6];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
       local_68.super_base_blob<256U>.m_data._M_elems[7];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
       local_68.super_base_blob<256U>.m_data._M_elems[8];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
       local_68.super_base_blob<256U>.m_data._M_elems[9];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
       local_68.super_base_blob<256U>.m_data._M_elems[10];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
       local_68.super_base_blob<256U>.m_data._M_elems[0xb];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
       local_68.super_base_blob<256U>.m_data._M_elems[0xc];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
       local_68.super_base_blob<256U>.m_data._M_elems[0xd];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
       local_68.super_base_blob<256U>.m_data._M_elems[0xe];
  local_48.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
       local_68.super_base_blob<256U>.m_data._M_elems[0xf];
  iVar1 = std::
          _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
          ::lower_bound(in_RSI,&local_48);
  if ((_Rb_tree_header *)iVar1._M_node == &(in_RSI->_M_impl).super__Rb_tree_header) {
    iVar1._M_node = (in_RSI->_M_impl).super__Rb_tree_header._M_header._M_left;
  }
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    CVar2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    CVar2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (CTransactionRef)CVar2.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  __stack_chk_fail();
}

Assistant:

CTransactionRef RandomOrphan()
    {
        std::map<Wtxid, OrphanTx>::iterator it;
        it = m_orphans.lower_bound(Wtxid::FromUint256(m_rng.rand256()));
        if (it == m_orphans.end())
            it = m_orphans.begin();
        return it->second.tx;
    }